

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O2

bool __thiscall mcsFile::ReadNextSector(mcsFile *this)

{
  uchar uVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  RecInfo rec;
  RecInfo local_46;
  
  bVar2 = ProcessNextLine(this,&local_46);
  if (bVar2) {
    if (local_46.type == '\x04') {
      if (local_46.ndata == 2) {
        this->startAddr = (ulong)local_46.data[1] << 0x10;
        this->numBytes = 0;
        uVar4 = 0;
        while ((uVar4 < 0x10000 &&
               (bVar2 = ProcessNextLine(this,&local_46), uVar1 = local_46.type, bVar2))) {
          if (local_46.type == '\0') {
            if (this->numBytes != (ulong)local_46.addr) {
              poVar3 = std::operator<<((ostream *)&std::cerr,"ReadNextSector: line ");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->line_num);
              poVar3 = std::operator<<(poVar3,", expected offset ");
              poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
              poVar3 = std::operator<<(poVar3,", got offset ");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_46.addr);
              goto LAB_0010817c;
            }
            uVar4 = (ulong)local_46.ndata;
            memcpy(this->curSector + this->numBytes,local_46.data,uVar4);
            uVar4 = uVar4 + this->numBytes;
            this->numBytes = uVar4;
          }
          else {
            if (local_46.type == '\x01') break;
            poVar3 = std::operator<<((ostream *)&std::cerr,"ReadNextSector: line ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->line_num);
            poVar3 = std::operator<<(poVar3," ignoring record type ");
            poVar3 = std::operator<<(poVar3,uVar1);
            std::endl<char,std::char_traits<char>>(poVar3);
            uVar4 = this->numBytes;
          }
        }
        uVar4 = this->numBytes;
        if (uVar4 < 0x10000) {
          memset(this->curSector + uVar4,0xff,0x10000 - uVar4);
          return true;
        }
        if (uVar4 == 0x10000) {
          return true;
        }
        poVar3 = std::operator<<((ostream *)&std::cerr,"ReadNextSector: too many bytes = ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::endl<char,std::char_traits<char>>(poVar3);
        return true;
      }
      poVar3 = std::operator<<((ostream *)&std::cerr,"ReadNextSector: line ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->line_num);
      poVar3 = std::operator<<(poVar3," has invalid data length = ");
      poVar3 = std::operator<<(poVar3,local_46.ndata);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"ReadNextSector: line ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->line_num);
      poVar3 = std::operator<<(poVar3," does not start a sector");
    }
LAB_0010817c:
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return false;
}

Assistant:

bool mcsFile::ReadNextSector()
{
    RecInfo rec;
    if (!ProcessNextLine(rec)) return false;
    if (rec.type != RECORD_EXT_LINEAR) {
        std::cerr << "ReadNextSector: line " << line_num << " does not start a sector" << std::endl;
        return false;
    }
    if (rec.ndata != 2) {
        std::cerr << "ReadNextSector: line " << line_num << " has invalid data length = "
                  << rec.ndata << std::endl;
        return false;
    }
    startAddr = ((rec.data[0]<<16)+rec.data[1]) << 16;
    numBytes = 0L;
    while ((numBytes < sizeof(curSector)) && ProcessNextLine(rec)) {
        if (rec.type == RECORD_DATA) {
            if (numBytes != rec.addr) {
                std::cerr << "ReadNextSector: line " << line_num
                          << ", expected offset " << numBytes << ", got offset "
                          << rec.addr << std::endl;
                return false;
            }
            memcpy(curSector+numBytes, rec.data, rec.ndata);
            numBytes += rec.ndata;
        }
        else if (rec.type == RECORD_EOF)
            break;
        else
            std::cerr << "ReadNextSector: line " << line_num 
                      << " ignoring record type " << rec.type << std::endl;
    }
    // Pad sector with 0xff, just in case
    if (numBytes < sizeof(curSector)) {
        memset(curSector+numBytes, 0xff, sizeof(curSector)-numBytes);
    }
    else if (numBytes > sizeof(curSector))
        std::cerr << "ReadNextSector: too many bytes = " << numBytes << std::endl;
    return true;
}